

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O1

int __thiscall ncnn::InstanceNorm::load_model(InstanceNorm *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int iVar5;
  void *local_68;
  int *piStack_60;
  size_t local_58;
  int local_50;
  Allocator *local_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  size_t local_30;
  
  (**mb->_vptr_ModelBin)(&local_68,mb,(ulong)(uint)this->channels,1);
  pMVar1 = &this->gamma_data;
  if (pMVar1 != (Mat *)&local_68) {
    if (piStack_60 != (int *)0x0) {
      LOCK();
      *piStack_60 = *piStack_60 + 1;
      UNLOCK();
    }
    piVar2 = (this->gamma_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->gamma_data).data;
        pAVar4 = (this->gamma_data).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->gamma_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->gamma_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->gamma_data).refcount = (int *)0x0;
    (this->gamma_data).dims = 0;
    (this->gamma_data).w = 0;
    (this->gamma_data).h = 0;
    (this->gamma_data).c = 0;
    (this->gamma_data).cstep = 0;
    (this->gamma_data).data = local_68;
    (this->gamma_data).refcount = piStack_60;
    (this->gamma_data).elemsize = local_58;
    (this->gamma_data).packing = local_50;
    (this->gamma_data).allocator = local_48;
    (this->gamma_data).dims = local_40;
    (this->gamma_data).w = iStack_3c;
    (this->gamma_data).h = iStack_38;
    (this->gamma_data).c = iStack_34;
    (this->gamma_data).cstep = local_30;
  }
  if (piStack_60 != (int *)0x0) {
    LOCK();
    *piStack_60 = *piStack_60 + -1;
    UNLOCK();
    if (*piStack_60 == 0) {
      if (local_48 == (Allocator *)0x0) {
        if (local_68 != (void *)0x0) {
          free(local_68);
        }
      }
      else {
        (**(code **)(*(long *)local_48 + 0x18))();
      }
    }
  }
  iVar5 = -100;
  if ((pMVar1->data != (void *)0x0) && ((long)(this->gamma_data).c * (this->gamma_data).cstep != 0))
  {
    (**mb->_vptr_ModelBin)(&local_68,mb,(ulong)(uint)this->channels);
    pMVar1 = &this->beta_data;
    if (pMVar1 != (Mat *)&local_68) {
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + 1;
        UNLOCK();
      }
      piVar2 = (this->beta_data).refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar3 = (this->beta_data).data;
          pAVar4 = (this->beta_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (**(code **)(*(long *)pAVar4 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->beta_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->beta_data).elemsize + 4) = 0;
      pMVar1->data = (void *)0x0;
      (this->beta_data).refcount = (int *)0x0;
      (this->beta_data).dims = 0;
      (this->beta_data).w = 0;
      (this->beta_data).h = 0;
      (this->beta_data).c = 0;
      (this->beta_data).cstep = 0;
      (this->beta_data).data = local_68;
      (this->beta_data).refcount = piStack_60;
      (this->beta_data).elemsize = local_58;
      (this->beta_data).packing = local_50;
      (this->beta_data).allocator = local_48;
      (this->beta_data).dims = local_40;
      (this->beta_data).w = iStack_3c;
      (this->beta_data).h = iStack_38;
      (this->beta_data).c = iStack_34;
      (this->beta_data).cstep = local_30;
    }
    if (piStack_60 != (int *)0x0) {
      LOCK();
      *piStack_60 = *piStack_60 + -1;
      UNLOCK();
      if (*piStack_60 == 0) {
        if (local_48 == (Allocator *)0x0) {
          if (local_68 != (void *)0x0) {
            free(local_68);
          }
        }
        else {
          (**(code **)(*(long *)local_48 + 0x18))();
        }
      }
    }
    if ((pMVar1->data != (void *)0x0) &&
       (iVar5 = -100, (long)(this->beta_data).c * (this->beta_data).cstep != 0)) {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int InstanceNorm::load_model(const ModelBin& mb)
{
    gamma_data = mb.load(channels, 1);
    if (gamma_data.empty())
        return -100;

    beta_data = mb.load(channels, 1);
    if (beta_data.empty())
        return -100;

    return 0;
}